

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

bool __thiscall absl::AbslParseFlag(absl *this,string_view text,LogSeverity *dst,string *err)

{
  bool bVar1;
  int *dst_00;
  type_conflict2 *ptVar2;
  string_view piece1;
  string_view text_00;
  string_view str;
  string_view piece2;
  string_view piece2_00;
  string_view piece2_01;
  string_view piece2_02;
  string_view piece2_03;
  string_view piece2_04;
  type_conflict2 numeric_value;
  
  ptVar2 = (type_conflict2 *)text._M_str;
  str._M_str = (char *)text._M_len;
  str._M_len = (size_t)this;
  piece1 = StripAsciiWhitespace(str);
  piece1._M_len = piece1._M_len;
  if (piece1._M_len == 0) {
    std::__cxx11::string::assign((char *)dst);
    return false;
  }
  piece2._M_str = "dfatal";
  piece2._M_len = 6;
  bVar1 = EqualsIgnoreCase(piece1,piece2);
  if ((!bVar1) &&
     (piece2_00._M_str = "klogdebugfatal", piece2_00._M_len = 0xe,
     bVar1 = EqualsIgnoreCase(piece1,piece2_00), !bVar1)) {
    if ((byte)(*piece1._M_str | 0x20U) == 0x6b) {
      piece1._M_str = piece1._M_str + 1;
      piece1._M_len = piece1._M_len - 1;
    }
    piece2_01._M_str = "info";
    piece2_01._M_len = 4;
    bVar1 = EqualsIgnoreCase(piece1,piece2_01);
    if (bVar1) {
      *ptVar2 = 0;
      return true;
    }
    piece2_02._M_str = "warning";
    piece2_02._M_len = 7;
    bVar1 = EqualsIgnoreCase(piece1,piece2_02);
    if (bVar1) {
      *ptVar2 = 1;
      return true;
    }
    piece2_03._M_str = "error";
    piece2_03._M_len = 5;
    bVar1 = EqualsIgnoreCase(piece1,piece2_03);
    if (bVar1) {
      *ptVar2 = 2;
      return true;
    }
    piece2_04._M_str = "fatal";
    piece2_04._M_len = 5;
    dst_00 = (int *)0x15b789;
    bVar1 = EqualsIgnoreCase(piece1,piece2_04);
    if (!bVar1) {
      text_00._M_str = (char *)&numeric_value;
      text_00._M_len = (size_t)piece1._M_str;
      bVar1 = flags_internal::ParseFlagImpl<int>((flags_internal *)piece1._M_len,text_00,dst_00);
      if (!bVar1) {
        std::__cxx11::string::assign((char *)dst);
        return bVar1;
      }
      *ptVar2 = numeric_value;
      return bVar1;
    }
  }
  *ptVar2 = 3;
  return true;
}

Assistant:

bool AbslParseFlag(absl::string_view text, absl::LogSeverity* dst,
                   std::string* err) {
  text = absl::StripAsciiWhitespace(text);
  if (text.empty()) {
    *err = "no value provided";
    return false;
  }
  if (absl::EqualsIgnoreCase(text, "dfatal")) {
    *dst = absl::kLogDebugFatal;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "klogdebugfatal")) {
    *dst = absl::kLogDebugFatal;
    return true;
  }
  if (text.front() == 'k' || text.front() == 'K') text.remove_prefix(1);
  if (absl::EqualsIgnoreCase(text, "info")) {
    *dst = absl::LogSeverity::kInfo;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "warning")) {
    *dst = absl::LogSeverity::kWarning;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "error")) {
    *dst = absl::LogSeverity::kError;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "fatal")) {
    *dst = absl::LogSeverity::kFatal;
    return true;
  }
  std::underlying_type<absl::LogSeverity>::type numeric_value;
  if (absl::ParseFlag(text, &numeric_value, err)) {
    *dst = static_cast<absl::LogSeverity>(numeric_value);
    return true;
  }
  *err =
      "only integers, absl::LogSeverity enumerators, and DFATAL are accepted";
  return false;
}